

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__horizontal_gather_7_channels_with_n_coeffs_mod1
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float *pfVar10;
  int iVar11;
  float *pfVar12;
  long lVar13;
  float *pfVar14;
  float *pfVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  
  pfVar1 = output_buffer + output_sub_size * 7;
  pfVar12 = horizontal_coefficients + 4;
  do {
    lVar13 = (long)(horizontal_contributors->n0 * 7);
    pfVar10 = decode_buffer + lVar13;
    fVar23 = *horizontal_coefficients;
    fVar31 = horizontal_coefficients[1];
    fVar24 = horizontal_coefficients[2];
    fVar2 = horizontal_coefficients[3];
    fVar16 = pfVar10[0xe] * fVar24 + *pfVar10 * fVar23;
    fVar17 = pfVar10[0xf] * fVar24 + pfVar10[1] * fVar23;
    fVar18 = pfVar10[0x10] * fVar24 + pfVar10[2] * fVar23;
    fVar19 = pfVar10[0x11] * fVar24 + pfVar10[3] * fVar23;
    fVar20 = pfVar10[0x11] * fVar24 + pfVar10[3] * fVar23;
    fVar21 = pfVar10[0x12] * fVar24 + pfVar10[4] * fVar23;
    fVar22 = pfVar10[0x13] * fVar24 + pfVar10[5] * fVar23;
    fVar23 = pfVar10[0x14] * fVar24 + pfVar10[6] * fVar23;
    fVar24 = pfVar10[0x15] * fVar2 + pfVar10[7] * fVar31;
    fVar25 = pfVar10[0x16] * fVar2 + pfVar10[8] * fVar31;
    fVar26 = pfVar10[0x17] * fVar2 + pfVar10[9] * fVar31;
    fVar27 = pfVar10[0x18] * fVar2 + pfVar10[10] * fVar31;
    fVar28 = pfVar10[0x18] * fVar2 + fVar31 * pfVar10[10];
    fVar29 = pfVar10[0x19] * fVar2 + fVar31 * pfVar10[0xb];
    fVar30 = pfVar10[0x1a] * fVar2 + fVar31 * pfVar10[0xc];
    fVar31 = pfVar10[0x1b] * fVar2 + fVar31 * pfVar10[0xd];
    iVar11 = (~horizontal_contributors->n0 + horizontal_contributors->n1 >> 2) + 1;
    pfVar10 = decode_buffer + lVar13 + 0x1c;
    pfVar15 = pfVar12;
    do {
      pfVar14 = pfVar10;
      fVar2 = *pfVar15;
      fVar3 = pfVar15[1];
      fVar4 = pfVar15[2];
      fVar5 = pfVar15[3];
      fVar16 = pfVar14[0xe] * fVar4 + *pfVar14 * fVar2 + fVar16;
      fVar17 = pfVar14[0xf] * fVar4 + pfVar14[1] * fVar2 + fVar17;
      fVar18 = pfVar14[0x10] * fVar4 + pfVar14[2] * fVar2 + fVar18;
      fVar19 = pfVar14[0x11] * fVar4 + pfVar14[3] * fVar2 + fVar19;
      fVar20 = pfVar14[0x11] * fVar4 + pfVar14[3] * fVar2 + fVar20;
      fVar21 = pfVar14[0x12] * fVar4 + pfVar14[4] * fVar2 + fVar21;
      fVar22 = pfVar14[0x13] * fVar4 + pfVar14[5] * fVar2 + fVar22;
      fVar23 = pfVar14[0x14] * fVar4 + pfVar14[6] * fVar2 + fVar23;
      fVar24 = pfVar14[0x15] * fVar5 + pfVar14[7] * fVar3 + fVar24;
      fVar25 = pfVar14[0x16] * fVar5 + pfVar14[8] * fVar3 + fVar25;
      fVar26 = pfVar14[0x17] * fVar5 + pfVar14[9] * fVar3 + fVar26;
      fVar27 = pfVar14[0x18] * fVar5 + pfVar14[10] * fVar3 + fVar27;
      fVar28 = pfVar14[0x18] * fVar5 + fVar3 * pfVar14[10] + fVar28;
      fVar29 = pfVar14[0x19] * fVar5 + fVar3 * pfVar14[0xb] + fVar29;
      fVar30 = pfVar14[0x1a] * fVar5 + fVar3 * pfVar14[0xc] + fVar30;
      fVar31 = pfVar14[0x1b] * fVar5 + fVar3 * pfVar14[0xd] + fVar31;
      iVar11 = iVar11 + -1;
      pfVar15 = pfVar15 + 4;
      pfVar10 = pfVar14 + 0x1c;
    } while (1 < iVar11);
    fVar2 = *pfVar15;
    fVar3 = pfVar14[0x1c];
    fVar4 = pfVar14[0x1d];
    fVar5 = pfVar14[0x1e];
    fVar6 = pfVar14[0x1f];
    fVar7 = pfVar14[0x20];
    fVar8 = pfVar14[0x21];
    fVar9 = pfVar14[0x22];
    output_buffer[3] = fVar28 + fVar20 + pfVar14[0x1f] * fVar2;
    output_buffer[4] = fVar29 + fVar21 + fVar7 * fVar2;
    output_buffer[5] = fVar30 + fVar22 + fVar8 * fVar2;
    output_buffer[6] = fVar31 + fVar23 + fVar9 * fVar2;
    *output_buffer = fVar24 + fVar16 + fVar3 * fVar2;
    output_buffer[1] = fVar25 + fVar17 + fVar4 * fVar2;
    output_buffer[2] = fVar26 + fVar18 + fVar5 * fVar2;
    output_buffer[3] = fVar27 + fVar19 + fVar6 * fVar2;
    horizontal_coefficients = horizontal_coefficients + coefficient_width;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 7;
    pfVar12 = pfVar12 + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_n_coeffs_mod1 )( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    int n = ( ( horizontal_contributors->n1 - horizontal_contributors->n0 + 1 ) - 5 + 3 ) >> 2;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    STBIR_SIMD_NO_UNROLL_LOOP_START
    do {
      hc += 4;
      decode += STBIR__horizontal_channels * 4;
      stbir__4_coeff_continue_from_4( 0 );
      --n;
    } while ( n > 0 );
    stbir__1_coeff_remnant( 4 );
    stbir__store_output();
  } while ( output < output_end );
}